

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

TranslationBlock_conflict *
tb_link_page(uc_struct_conflict15 *uc,TranslationBlock_conflict *tb,tb_page_addr_t phys_pc,
            tb_page_addr_t phys_page2)

{
  uint32_t hash;
  void *pvStack_48;
  uint32_t h;
  void *existing_tb;
  PageDesc *p2;
  PageDesc *p;
  tb_page_addr_t phys_page2_local;
  tb_page_addr_t phys_pc_local;
  TranslationBlock_conflict *tb_local;
  uc_struct_conflict15 *uc_local;
  
  existing_tb = (void *)0x0;
  p = (PageDesc *)phys_page2;
  phys_page2_local = phys_pc;
  phys_pc_local = (tb_page_addr_t)tb;
  tb_local = (TranslationBlock_conflict *)uc;
  if (phys_pc == 0xffffffffffffffff) {
    if ((tb->cflags & 0x10000) == 0) {
      __assert_fail("tb->cflags & CF_NOCACHE",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                    ,0x66c,
                    "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                   );
    }
    tb->page_addr[1] = 0xffffffffffffffff;
    tb->page_addr[0] = 0xffffffffffffffff;
    uc_local = (uc_struct_conflict15 *)tb;
  }
  else {
    page_lock_pair(uc,&p2,phys_pc,(PageDesc **)&existing_tb,phys_page2,1);
    tb_page_add((uc_struct_conflict15 *)tb_local,p2,(TranslationBlock_conflict *)phys_pc_local,0,
                phys_page2_local & 0xffffc000);
    if (existing_tb == (void *)0x0) {
      *(undefined8 *)(phys_pc_local + 0x48) = 0xffffffffffffffff;
    }
    else {
      tb_page_add((uc_struct_conflict15 *)tb_local,(PageDesc *)existing_tb,
                  (TranslationBlock_conflict *)phys_pc_local,1,(tb_page_addr_t)p);
    }
    if ((*(uint *)(phys_pc_local + 0x10) & 0x10000) == 0) {
      pvStack_48 = (void *)0x0;
      hash = tb_hash_func(phys_page2_local,*(target_ulong_conflict *)phys_pc_local,
                          *(uint32_t *)(phys_pc_local + 8),
                          *(uint *)(phys_pc_local + 0x10) & 0xff0affff,
                          *(uint32_t *)(phys_pc_local + 0x14));
      *(uint32_t *)(phys_pc_local + 0x90) = hash;
      qht_insert((uc_struct_conflict5 *)tb_local,(qht *)(tb_local[4].jmp_dest[1] + 0x80b8),
                 (void *)phys_pc_local,hash,&stack0xffffffffffffffb8);
      if (pvStack_48 != (void *)0x0) {
        tb_page_remove(p2,(TranslationBlock_conflict *)phys_pc_local);
        invalidate_page_bitmap(p2);
        if (existing_tb != (void *)0x0) {
          tb_page_remove((PageDesc *)existing_tb,(TranslationBlock_conflict *)phys_pc_local);
          invalidate_page_bitmap((PageDesc *)existing_tb);
        }
        phys_pc_local = (tb_page_addr_t)pvStack_48;
      }
    }
    if ((existing_tb != (void *)0x0) && ((PageDesc *)existing_tb != p2)) {
      page_unlock((PageDesc *)existing_tb);
    }
    page_unlock(p2);
    uc_local = (uc_struct_conflict15 *)phys_pc_local;
  }
  return (TranslationBlock_conflict *)uc_local;
}

Assistant:

static TranslationBlock *
tb_link_page(struct uc_struct *uc, TranslationBlock *tb, tb_page_addr_t phys_pc,
             tb_page_addr_t phys_page2)
{
    PageDesc *p;
    PageDesc *p2 = NULL;

    assert_memory_lock();

    if (phys_pc == -1) {
        /*
         * If the TB is not associated with a physical RAM page then
         * it must be a temporary one-insn TB, and we have nothing to do
         * except fill in the page_addr[] fields.
         */
        assert(tb->cflags & CF_NOCACHE);
        tb->page_addr[0] = tb->page_addr[1] = -1;
        return tb;
    }

    /*
     * Add the TB to the page list, acquiring first the pages's locks.
     * We keep the locks held until after inserting the TB in the hash table,
     * so that if the insertion fails we know for sure that the TBs are still
     * in the page descriptors.
     * Note that inserting into the hash table first isn't an option, since
     * we can only insert TBs that are fully initialized.
     */
    page_lock_pair(uc, &p, phys_pc, &p2, phys_page2, 1);
    tb_page_add(uc, p, tb, 0, phys_pc & TARGET_PAGE_MASK);
    if (p2) {
        tb_page_add(uc, p2, tb, 1, phys_page2);
    } else {
        tb->page_addr[1] = -1;
    }

    if (!(tb->cflags & CF_NOCACHE)) {
        void *existing_tb = NULL;
        uint32_t h;

        /* add in the hash table */
        h = tb_hash_func(phys_pc, tb->pc, tb->flags, tb->cflags & CF_HASH_MASK,
                         tb->trace_vcpu_dstate);
        tb->hash = h;   // unicorn needs this so it can remove this tb
        qht_insert(uc, &uc->tcg_ctx->tb_ctx.htable, tb, h, &existing_tb);

        /* remove TB from the page(s) if we couldn't insert it */
        if (unlikely(existing_tb)) {
            tb_page_remove(p, tb);
            invalidate_page_bitmap(p);
            if (p2) {
                tb_page_remove(p2, tb);
                invalidate_page_bitmap(p2);
            }
            tb = existing_tb;
        }
    }

    if (p2 && p2 != p) {
        page_unlock(p2);
    }
    page_unlock(p);

    return tb;
}